

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::RunListFile
          (cmMakefile *this,cmListFile *listFile,string *filenametoread,DeferCommands *defer)

{
  cmStateSnapshot *this_00;
  pointer pDVar1;
  string *psVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  cmExecutionStatus status;
  string id;
  DeferScope scope;
  DeferCallScope callScope;
  string currentFile;
  string currentParentFile;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&currentFile);
  psVar2 = GetSafeDefinition(this,(string *)&status);
  std::__cxx11::string::string((string *)&currentParentFile,(string *)psVar2);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&id);
  psVar2 = GetSafeDefinition(this,(string *)&status);
  std::__cxx11::string::string((string *)&currentFile,(string *)psVar2);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&id);
  value._M_str = (filenametoread->_M_dataplus)._M_p;
  value._M_len = filenametoread->_M_string_length;
  AddDefinition(this,(string *)&status,value);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_DIR",(allocator<char> *)&scope);
  cmsys::SystemTools::GetFilenamePath(&id,filenametoread);
  value_00._M_str = id._M_dataplus._M_p;
  value_00._M_len = id._M_string_length;
  AddDefinition(this,(string *)&status,value_00);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&id);
  this_00 = &this->StateSnapshot;
  cmStateSnapshot::GetDefinition(this_00,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&id);
  cmStateSnapshot::GetDefinition(this_00,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_DIR",(allocator<char> *)&id);
  cmStateSnapshot::GetDefinition(this_00,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  lVar5 = (long)(listFile->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(listFile->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  lVar3 = 0;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    cmExecutionStatus::cmExecutionStatus(&status,this);
    local_80._M_engaged = false;
    ExecuteCommand(this,(cmListFileFunction *)
                        ((long)&(((listFile->Functions).
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->Impl).
                                super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                        + lVar3),&status,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_80);
    bVar6 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar6) {
LAB_00248201:
      cmExecutionStatus::~cmExecutionStatus(&status);
      break;
    }
    if (status.ReturnInvoked == true) {
      RaiseScope(this,&status.Variables);
      goto LAB_00248201;
    }
    cmExecutionStatus::~cmExecutionStatus(&status);
    lVar3 = lVar3 + 0x10;
  }
  if (defer != (DeferCommands *)0x0) {
    DeferScope::DeferScope(&scope,this,filenametoread);
    lVar3 = 0;
    uVar4 = 0;
    while( true ) {
      pDVar1 = (defer->Commands).
               super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(defer->Commands).
                         super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x50) <= uVar4
         ) break;
      if (*(long *)((long)&(pDVar1->Id)._M_string_length + lVar3) != 0) {
        std::__cxx11::string::string
                  ((string *)&id,(string *)((long)&(pDVar1->Id)._M_dataplus + lVar3));
        DeferCallScope::DeferCallScope
                  (&callScope,this,(string *)((long)&(pDVar1->FilePath)._M_dataplus + lVar3));
        cmExecutionStatus::cmExecutionStatus(&status,this);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,&id);
        ExecuteCommand(this,(cmListFileFunction *)((long)&(pDVar1->Command).Impl + lVar3),&status,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(&local_58);
        bVar6 = cmSystemTools::GetFatalErrorOccurred();
        cmExecutionStatus::~cmExecutionStatus(&status);
        DeferCallScope::~DeferCallScope(&callScope);
        std::__cxx11::string::~string((string *)&id);
        if (bVar6) break;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x50;
    }
    DeferScope::~DeferScope(&scope);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&id);
  value_01._M_str = currentParentFile._M_dataplus._M_p;
  value_01._M_len = currentParentFile._M_string_length;
  AddDefinition(this,(string *)&status,value_01);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&id);
  value_02._M_str = currentFile._M_dataplus._M_p;
  value_02._M_len = currentFile._M_string_length;
  AddDefinition(this,(string *)&status,value_02);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_DIR",(allocator<char> *)&scope);
  cmsys::SystemTools::GetFilenamePath(&id,&currentFile);
  value_03._M_str = id._M_dataplus._M_p;
  value_03._M_len = id._M_string_length;
  AddDefinition(this,(string *)&status,value_03);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&id);
  cmStateSnapshot::GetDefinition(this_00,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&id);
  cmStateSnapshot::GetDefinition(this_00,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_CURRENT_LIST_DIR",(allocator<char> *)&id);
  cmStateSnapshot::GetDefinition(this_00,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::~string((string *)&currentFile);
  std::__cxx11::string::~string((string *)&currentParentFile);
  return;
}

Assistant:

void cmMakefile::RunListFile(cmListFile const& listFile,
                             std::string const& filenametoread,
                             DeferCommands* defer)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile =
    this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(filenametoread));

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for (size_t i = 0; i < numberFunctions; ++i) {
    cmExecutionStatus status(*this);
    this->ExecuteCommand(listFile.Functions[i], status);
    if (cmSystemTools::GetFatalErrorOccurred()) {
      break;
    }
    if (status.GetReturnInvoked()) {
      this->RaiseScope(status.GetReturnVariables());
      // Exit early due to return command.
      break;
    }
  }

  // Run any deferred commands.
  if (defer) {
    // Add a backtrace level indicating calls are deferred.
    DeferScope scope(this, filenametoread);

    // Iterate by index in case one deferred call schedules another.
    // NOLINTNEXTLINE(modernize-loop-convert)
    for (size_t i = 0; i < defer->Commands.size(); ++i) {
      DeferCommand& d = defer->Commands[i];
      if (d.Id.empty()) {
        // Canceled.
        continue;
      }
      // Mark as executed.
      std::string id = std::move(d.Id);

      // The deferred call may have come from another file.
      DeferCallScope callScope(this, d.FilePath);

      cmExecutionStatus status(*this);
      this->ExecuteCommand(d.Command, status, std::move(id));
      if (cmSystemTools::GetFatalErrorOccurred()) {
        break;
      }
    }
  }

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile));
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}